

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
duckdb::BoundReferenceExpression::Deserialize(Deserializer *deserializer)

{
  unsigned_long index_00;
  Deserializer *in_RDI;
  unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
  result;
  unsigned_long index;
  LogicalType return_type;
  pointer in_stack_ffffffffffffff68;
  LogicalType *this;
  char *in_stack_ffffffffffffff78;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  field_id_t in_stack_ffffffffffffffa6;
  Deserializer *in_stack_ffffffffffffffa8;
  LogicalType *in_stack_ffffffffffffffd8;
  BoundReferenceExpression *in_stack_ffffffffffffffe0;
  
  this_00._M_head_impl = (Expression *)in_RDI;
  Deserializer::ReadProperty<duckdb::LogicalType>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6,
             (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  index_00 = Deserializer::ReadPropertyWithDefault<unsigned_long>
                       ((Deserializer *)this_00._M_head_impl,(field_id_t)((ulong)in_RDI >> 0x30),
                        in_stack_ffffffffffffff78);
  operator_new(0x60);
  this = (LogicalType *)&stack0xffffffffffffffa0;
  LogicalType::LogicalType(this,(LogicalType *)in_stack_ffffffffffffff68);
  BoundReferenceExpression(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,index_00);
  unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>
  ::unique_ptr<std::default_delete<duckdb::BoundReferenceExpression>,void>
            ((unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
              *)this,in_stack_ffffffffffffff68);
  LogicalType::~LogicalType((LogicalType *)0xad0a6a);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this,
             (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>_>
              *)in_stack_ffffffffffffff68);
  unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                 *)0xad0a83);
  LogicalType::~LogicalType((LogicalType *)0xad0a8d);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundReferenceExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(201, "index");
	auto result = duckdb::unique_ptr<BoundReferenceExpression>(new BoundReferenceExpression(std::move(return_type), index));
	return std::move(result);
}